

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForX11Event(double *timeout)

{
  int iVar1;
  GLFWbool GVar2;
  pollfd fd;
  double *in_stack_00000048;
  nfds_t in_stack_00000050;
  pollfd *in_stack_00000058;
  
  do {
    iVar1 = (*_glfw.x11.xlib.Pending)(_glfw.x11.display);
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = _glfwPollPOSIX(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForX11Event(double* timeout)
{
    struct pollfd fd = { ConnectionNumber(_glfw.x11.display), POLLIN };

    while (!XPending(_glfw.x11.display))
    {
        if (!_glfwPollPOSIX(&fd, 1, timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}